

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::SimpleDirectiveSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if (((((kind == CellDefineDirective) || (kind - DelayModeDistributedDirective < 4)) ||
       (kind == EndCellDefineDirective)) ||
      ((kind - EndKeywordsDirective < 3 || (kind == NoUnconnectedDriveDirective)))) ||
     ((kind - ProtectDirective < 2 ||
      ((kind == ResetAllDirective || (kind == UndefineAllDirective)))))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SimpleDirectiveSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::CellDefineDirective:
        case SyntaxKind::DelayModeDistributedDirective:
        case SyntaxKind::DelayModePathDirective:
        case SyntaxKind::DelayModeUnitDirective:
        case SyntaxKind::DelayModeZeroDirective:
        case SyntaxKind::EndCellDefineDirective:
        case SyntaxKind::EndKeywordsDirective:
        case SyntaxKind::EndProtectDirective:
        case SyntaxKind::EndProtectedDirective:
        case SyntaxKind::NoUnconnectedDriveDirective:
        case SyntaxKind::ProtectDirective:
        case SyntaxKind::ProtectedDirective:
        case SyntaxKind::ResetAllDirective:
        case SyntaxKind::UndefineAllDirective:
            return true;
        default:
            return false;
    }
}